

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<unsigned_long>::test_one<(libdivide::Branching)1>
          (DivideTest<unsigned_long> *this,unsigned_long numer,unsigned_long denom,
          divider<unsigned_long,_(libdivide::Branching)1> *the_divider)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  string_class local_50;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = numer;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (the_divider->div).denom.magic;
  lVar3 = SUB168(auVar1 * auVar2,8);
  uVar4 = (numer - lVar3 >> 1) + lVar3 >> ((ulong)(the_divider->div).denom.more & 0x3f);
  if (uVar4 == numer / denom) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failure for ",0xc);
  testcase_name_abi_cxx11_(&local_50,this,1);
  std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator<<((ostream *)&std::cerr,": ");
  std::ostream::operator<<((ostream *)&std::cerr,numer);
  std::operator<<((ostream *)&std::cerr," / ");
  std::ostream::operator<<((ostream *)&std::cerr,denom);
  std::operator<<((ostream *)&std::cerr," = ");
  std::ostream::operator<<((ostream *)&std::cerr,numer / denom);
  std::operator<<((ostream *)&std::cerr,", but got ");
  std::ostream::operator<<((ostream *)&std::cerr,uVar4);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(1);
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }